

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_OrdinaryIsInstanceOf(JSContext *ctx,JSValue val,JSValue obj)

{
  JSValueUnion JVar1;
  int iVar2;
  int iVar3;
  JSValueUnion JVar4;
  JSRefCountHeader *p;
  JSValue v;
  JSValue obj_00;
  
  JVar4 = val.u;
  iVar2 = JS_IsFunction(ctx,obj);
  if (iVar2 == 0) {
    return 0;
  }
  if (*(short *)((long)obj.u.ptr + 6) == 0xe) {
    iVar2 = JS_IsInstanceOf(ctx,val,**(JSValue **)((long)obj.u.ptr + 0x30));
    return iVar2;
  }
  if ((int)val.tag != -1) {
    return 0;
  }
  v = JS_GetPropertyInternal(ctx,obj,0x3b,obj,0);
  iVar2 = -1;
  if ((int)v.tag != 6) {
    if ((int)v.tag == -1) {
      do {
        JVar1 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)JVar4.ptr + 0x18) + 0x38))->ptr;
        if ((int *)JVar1.ptr == (int *)0x0) {
          if (*(short *)((long)JVar4.ptr + 6) != 0x29) goto LAB_0011947c;
          *(int *)JVar4.ptr = *JVar4.ptr + 1;
          obj_00.tag = -1;
          obj_00.u.ptr = JVar4.ptr;
          goto LAB_001194a9;
        }
        JVar4 = JVar1;
      } while (JVar1.ptr != v.u.ptr);
LAB_0011945b:
      iVar2 = 1;
    }
    else {
      JS_ThrowTypeError(ctx,"operand \'prototype\' property is not an object");
    }
  }
  goto LAB_0011947e;
LAB_0011947c:
  iVar2 = 0;
  goto LAB_0011947e;
  while( true ) {
    if ((int)obj_00.tag == 6) goto LAB_0011947e;
    if (v.u.ptr == obj_00.u.ptr) {
      JS_FreeValue(ctx,obj_00);
      goto LAB_0011945b;
    }
    iVar3 = js_poll_interrupts(ctx);
    if (iVar3 != 0) break;
LAB_001194a9:
    obj_00 = JS_GetPrototypeFree(ctx,obj_00);
    if ((int)obj_00.tag == 2) goto LAB_0011947c;
  }
  JS_FreeValue(ctx,obj_00);
LAB_0011947e:
  JS_FreeValue(ctx,v);
  return iVar2;
}

Assistant:

static int JS_OrdinaryIsInstanceOf(JSContext *ctx, JSValueConst val,
                                   JSValueConst obj)
{
    JSValue obj_proto;
    JSObject *proto;
    const JSObject *p, *proto1;
    BOOL ret;

    if (!JS_IsFunction(ctx, obj))
        return FALSE;
    p = JS_VALUE_GET_OBJ(obj);
    if (p->class_id == JS_CLASS_BOUND_FUNCTION) {
        JSBoundFunction *s = p->u.bound_function;
        return JS_IsInstanceOf(ctx, val, s->func_obj);
    }

    /* Only explicitly boxed values are instances of constructors */
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return FALSE;
    obj_proto = JS_GetProperty(ctx, obj, JS_ATOM_prototype);
    if (JS_VALUE_GET_TAG(obj_proto) != JS_TAG_OBJECT) {
        if (!JS_IsException(obj_proto))
            JS_ThrowTypeError(ctx, "operand 'prototype' property is not an object");
        ret = -1;
        goto done;
    }
    proto = JS_VALUE_GET_OBJ(obj_proto);
    p = JS_VALUE_GET_OBJ(val);
    for(;;) {
        proto1 = p->shape->proto;
        if (!proto1) {
            /* slow case if proxy in the prototype chain */
            if (unlikely(p->class_id == JS_CLASS_PROXY)) {
                JSValue obj1;
                obj1 = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, (JSObject *)p));
                for(;;) {
                    obj1 = JS_GetPrototypeFree(ctx, obj1);
                    if (JS_IsException(obj1)) {
                        ret = -1;
                        break;
                    }
                    if (JS_IsNull(obj1)) {
                        ret = FALSE;
                        break;
                    }
                    if (proto == JS_VALUE_GET_OBJ(obj1)) {
                        JS_FreeValue(ctx, obj1);
                        ret = TRUE;
                        break;
                    }
                    /* must check for timeout to avoid infinite loop */
                    if (js_poll_interrupts(ctx)) {
                        JS_FreeValue(ctx, obj1);
                        ret = -1;
                        break;
                    }
                }
            } else {
                ret = FALSE;
            }
            break;
        }
        p = proto1;
        if (proto == p) {
            ret = TRUE;
            break;
        }
    }
done:
    JS_FreeValue(ctx, obj_proto);
    return ret;
}